

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O3

void Lf_ManAnalyzeCoDrivers(Gia_Man_t *p,int *pnDrivers,int *pnInverts)

{
  uint *puVar1;
  uint uVar2;
  int *piVar3;
  int iVar4;
  void *__s;
  ulong uVar5;
  long lVar6;
  char *__function;
  uint uVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  char *__file;
  char *__assertion;
  int iVar11;
  
  iVar9 = p->nObjs;
  iVar4 = 0x10;
  if (0xe < iVar9 - 1U) {
    iVar4 = iVar9;
  }
  if (iVar4 == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = malloc((long)iVar4 << 2);
  }
  uVar10 = 0;
  memset(__s,0,(long)iVar9 * 4);
  uVar5 = (ulong)p->vCos->nSize;
  if ((long)uVar5 < 1) {
    if (0 < iVar9) goto LAB_0071070e;
    iVar9 = 0;
    iVar8 = 0;
    iVar11 = 0;
    iVar4 = 0;
    if (__s == (void *)0x0) goto LAB_0071073d;
  }
  else {
    piVar3 = p->vCos->pArray;
    do {
      iVar4 = piVar3[uVar10];
      if (((long)iVar4 < 0) || (iVar9 <= iVar4)) {
        __assertion = "v >= 0 && v < p->nObjs";
        __file = 
        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
        ;
        __function = "Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)";
LAB_00710791:
        __assert_fail(__assertion,__file,0x1af,__function);
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      uVar2 = *(uint *)(p->pObjs + iVar4);
      uVar7 = iVar4 - (uVar2 & 0x1fffffff);
      if (((int)uVar7 < 0) || (iVar9 <= (int)uVar7)) {
        __assertion = "i >= 0 && i < p->nSize";
        __file = 
        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
        ;
        __function = "int *Vec_IntEntryP(Vec_Int_t *, int)";
        goto LAB_00710791;
      }
      puVar1 = (uint *)((long)__s + (ulong)uVar7 * 4);
      *puVar1 = *puVar1 | ((uVar2 >> 0x1d & 1) != 0) + 1;
      uVar10 = uVar10 + 1;
    } while (uVar10 < uVar5);
LAB_0071070e:
    lVar6 = 0;
    iVar8 = 0;
    iVar11 = 0;
    do {
      iVar4 = *(int *)((long)__s + lVar6 * 4);
      iVar11 = (iVar11 + 1) - (uint)(iVar4 == 0);
      iVar8 = iVar8 + (uint)(iVar4 == 3);
      lVar6 = lVar6 + 1;
    } while (iVar9 != lVar6);
  }
  free(__s);
  iVar9 = iVar8;
  iVar4 = iVar11;
LAB_0071073d:
  *pnDrivers = iVar4;
  *pnInverts = iVar9;
  return;
}

Assistant:

void Lf_ManAnalyzeCoDrivers( Gia_Man_t * p, int * pnDrivers, int * pnInverts )
{
    Gia_Obj_t * pObj;
    int i, Entry, nDrivers, nInverts;
    Vec_Int_t * vMarks = Vec_IntStart( Gia_ManObjNum(p) );
    nDrivers = nInverts = 0;
    Gia_ManForEachCo( p, pObj, i )
        *Vec_IntEntryP( vMarks, Gia_ObjFaninId0p(p, pObj) ) |= Gia_ObjFaninC0(pObj) ? 2 : 1;
    Vec_IntForEachEntry( vMarks, Entry, i )
        nDrivers += (int)(Entry != 0), nInverts += (int)(Entry == 3);
    Vec_IntFree( vMarks );
    *pnDrivers = nDrivers;
    *pnInverts = nInverts;
}